

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block.cc
# Opt level: O2

char * leveldb::DecodeEntry
                 (char *p,char *limit,uint32_t *shared,uint32_t *non_shared,uint32_t *value_length)

{
  byte bVar1;
  long lVar2;
  uint uVar3;
  char *pcVar4;
  uint uVar5;
  char *pcVar6;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  if (2 < (long)limit - (long)p) {
    *shared = (uint)(byte)*p;
    *non_shared = (uint)(byte)p[1];
    bVar1 = p[2];
    uVar5 = (uint)bVar1;
    *value_length = (uint)bVar1;
    uVar3 = *non_shared;
    if ((*shared | uVar3 | (uint)bVar1) < 0x80) {
      pcVar6 = p + 3;
LAB_0054e028:
      pcVar4 = (char *)0x0;
      if (uVar5 + uVar3 <= (uint)((int)limit - (int)pcVar6)) {
        pcVar4 = pcVar6;
      }
      goto LAB_0054e034;
    }
    pcVar6 = GetVarint32Ptr(p,limit,shared);
    if (pcVar6 != (char *)0x0) {
      pcVar6 = GetVarint32Ptr(pcVar6,limit,non_shared);
      if (pcVar6 != (char *)0x0) {
        pcVar6 = GetVarint32Ptr(pcVar6,limit,value_length);
        if (pcVar6 != (char *)0x0) {
          uVar3 = *non_shared;
          uVar5 = *value_length;
          goto LAB_0054e028;
        }
      }
    }
  }
  pcVar4 = (char *)0x0;
LAB_0054e034:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return pcVar4;
  }
  __stack_chk_fail();
}

Assistant:

static inline const char* DecodeEntry(const char* p, const char* limit,
                                      uint32_t* shared, uint32_t* non_shared,
                                      uint32_t* value_length) {
  if (limit - p < 3) return nullptr;
  *shared = reinterpret_cast<const uint8_t*>(p)[0];
  *non_shared = reinterpret_cast<const uint8_t*>(p)[1];
  *value_length = reinterpret_cast<const uint8_t*>(p)[2];
  if ((*shared | *non_shared | *value_length) < 128) {
    // Fast path: all three values are encoded in one byte each
    p += 3;
  } else {
    if ((p = GetVarint32Ptr(p, limit, shared)) == nullptr) return nullptr;
    if ((p = GetVarint32Ptr(p, limit, non_shared)) == nullptr) return nullptr;
    if ((p = GetVarint32Ptr(p, limit, value_length)) == nullptr) return nullptr;
  }

  if (static_cast<uint32_t>(limit - p) < (*non_shared + *value_length)) {
    return nullptr;
  }
  return p;
}